

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

void __thiscall CTcMake::set_compiler_options(CTcMake *this)

{
  int iVar1;
  CTcTokenizer *in_RDI;
  char buf [256];
  CTcMakeDef *def;
  CTcMakePath *inc;
  CTcTokenizer *in_stack_fffffffffffffec8;
  CTcTokenizer *in_stack_fffffffffffffed0;
  CTcTokenizer *in_stack_fffffffffffffed8;
  char local_118 [256];
  CTcMakeDef *local_18;
  CTcTokStream *local_10;
  
  CTcMain::set_verbosity(G_tcmain,*(int *)&in_RDI->field_0x8c);
  CTcMain::set_show_err_numbers(G_tcmain,*(int *)&(in_RDI->p_).p_);
  CTcMain::set_pedantic(G_tcmain,*(int *)((long)&in_RDI->curbuf_ + 4));
  CTcMain::set_suppress_list
            (G_tcmain,(int *)(in_RDI->linebuf_)._vptr_CTcTokString,(size_t)(in_RDI->linebuf_).buf_);
  CTcMain::set_warnings(G_tcmain,*(int *)((long)&(in_RDI->p_).p_ + 4));
  CTcMain::set_test_report_mode(G_tcmain,(int)(in_RDI->unsplicebuf_).buf_size_);
  CTcMain::set_quote_filenames(G_tcmain,(int)(in_RDI->unsplicebuf_).buf_len_);
  G_debug = (int)(in_RDI->linebuf_).buf_size_;
  for (local_10 = in_RDI->str_; local_10 != (CTcTokStream *)0x0;
      local_10 = (CTcTokStream *)CTcMakePath::get_next((CTcMakePath *)local_10)) {
    in_stack_fffffffffffffed8 = G_tok;
    CTcMakePath::get_path((CTcMakePath *)0x20772c);
    CTcTokenizer::add_inc_path(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
  }
  if ((int)(in_RDI->linebuf_).buf_size_ != 0) {
    CTcTokenizer::add_define
              (in_RDI,(char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
  }
  if ((int)(in_RDI->unsplicebuf_).buf_size_ != 0) {
    CTcTokenizer::set_test_report_mode(G_tok,1);
  }
  sprintf(local_118,"__TADS_SYS_%s","POSIX_UNIX_MSWINDOWS");
  CTcTokenizer::add_define
            (in_RDI,(char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
  sprintf(local_118,"\'%s\'","POSIX_UNIX_MSWINDOWS");
  CTcTokenizer::add_define
            (in_RDI,(char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
  sprintf(local_118,"%d",3);
  CTcTokenizer::add_define
            (in_RDI,(char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
  sprintf(local_118,"%d",1);
  CTcTokenizer::add_define
            (in_RDI,(char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
  sprintf(local_118,"%d",1);
  CTcTokenizer::add_define
            (in_RDI,(char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
  CTcTokenizer::add_define
            (in_RDI,(char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
  for (local_18 = (CTcMakeDef *)in_RDI->desc_list_; local_18 != (CTcMakeDef *)0x0;
      local_18 = CTcMakeDef::get_next(local_18)) {
    iVar1 = CTcMakeDef::is_def(local_18);
    if (iVar1 == 0) {
      CTcMakeDef::get_sym((CTcMakeDef *)0x20794d);
      CTcTokenizer::undefine(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    }
    else {
      in_stack_fffffffffffffec8 = G_tok;
      in_stack_fffffffffffffed0 = (CTcTokenizer *)CTcMakeDef::get_sym((CTcMakeDef *)0x20790b);
      CTcMakeDef::get_expan((CTcMakeDef *)0x20791d);
      CTcTokenizer::add_define
                (in_RDI,(char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
    }
  }
  return;
}

Assistant:

void CTcMake::set_compiler_options()
{
    CTcMakePath *inc;
    CTcMakeDef *def;
    char buf[256];
    
    /* set the error verbosity and warning level modes */
    G_tcmain->set_verbosity(verbose_);
    G_tcmain->set_show_err_numbers(show_err_numbers_);
    G_tcmain->set_pedantic(pedantic_);
    G_tcmain->set_suppress_list(suppress_list_, suppress_cnt_);
    G_tcmain->set_warnings(show_warnings_);
    G_tcmain->set_test_report_mode(test_report_mode_);
    G_tcmain->set_quote_filenames(quoted_fname_mode_);

    /* set debug mode */
    G_debug = debug_;

    /* add the #include path entries */
    for (inc = inc_head_ ; inc != 0 ; inc = inc->get_next())
        G_tok->add_inc_path(inc->get_path());

    /* if we're in debug mode, add the __DEBUG pre-defined macro */
    if (debug_)
        G_tok->add_define("__DEBUG", "1");

    /* 
     *   if we're in test report mode, generate __FILE__ expansions with
     *   root names only 
     */
    if (test_report_mode_)
        G_tok->set_test_report_mode(TRUE);

    /* add the system-name pre-defined macro */
    sprintf(buf, "__TADS_SYS_%s", OS_SYSTEM_NAME);
    G_tok->add_define(buf, "1");

    /* add the pre-defined macro expanding to the system name */
    sprintf(buf, "'%s'", OS_SYSTEM_NAME);
    G_tok->add_define("__TADS_SYSTEM_NAME", buf);

    /* add the major and minor version number macros */
    sprintf(buf, "%d", TC_VSN_MAJOR);
    G_tok->add_define("__TADS_VERSION_MAJOR", buf);
    sprintf(buf, "%d", TC_VSN_MINOR);
    G_tok->add_define("__TADS_VERSION_MINOR", buf);

    /* add the preprocess macro format version number */
    sprintf(buf, "%d", TCTOK_MACRO_FORMAT_VERSION);
    G_tok->add_define("__TADS_MACRO_FORMAT_VERSION", buf);

    /* add a symbol for __TADS3 */
    G_tok->add_define("__TADS3", "1");

    /* add the preprocessor symbol definitions */
    for (def = def_head_ ; def != 0 ; def = def->get_next())
    {
        /* define or undefine the symbol as appropriate */
        if (def->is_def())
            G_tok->add_define(def->get_sym(), def->get_expan());
        else
            G_tok->undefine(def->get_sym());
    }
}